

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::writeDataToTexture
          (SparseTextureClampLookupColorTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  GLint GVar1;
  int iVar2;
  GLenum GVar3;
  ostream *poVar4;
  TestError *this_00;
  int iVar5;
  size_type __new_size;
  string *this_01;
  GLint depth;
  GLint local_3d8;
  int local_3d4;
  SparseTextureClampLookupColorTestCase *local_3d0;
  GLenum local_3c4;
  GLint height;
  GLint width;
  GLuint *local_3b8;
  ostream *local_3b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecData;
  string shader;
  string local_370;
  string local_350;
  string local_330;
  TokenStrings s;
  ShaderProgram program;
  ProgramSources sources;
  
  local_3b0 = (ostream *)
              &(this->super_SparseTextureClampLookupResidencyTestCase).
               super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
               super_SparseTextureCommitmentTestCase.field_0x88;
  local_3b8 = texture;
  poVar4 = std::operator<<(local_3b0,"Fill Texture with shader [level: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,level);
  std::operator<<(poVar4,"] - ");
  if (level <= (this->super_SparseTextureClampLookupResidencyTestCase).
               super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
               super_SparseTextureCommitmentTestCase.mState.levels + -1) {
    SparseTextureUtils::getTextureLevelSize
              (target,&(this->super_SparseTextureClampLookupResidencyTestCase).
                       super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                       super_SparseTextureCommitmentTestCase.mState,level,&width,&height,&depth);
    if ((0 < height && 0 < width) &&
       ((this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
        super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.minDepth
        <= depth)) {
      if (target == 0x8513) {
        depth = depth * 6;
      }
      GVar1 = depth;
      iVar5 = height * width;
      local_3d8 = level;
      local_3d0 = this;
      iVar2 = tcu::TextureFormat::getPixelSize
                        (&(this->super_SparseTextureClampLookupResidencyTestCase).
                          super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                          super_SparseTextureCommitmentTestCase.mState.format);
      vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __new_size = (size_type)(iVar2 * GVar1 * iVar5);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecData,__new_size);
      memset(vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0xff,__new_size);
      local_3c4 = 0x822a;
      if (format != 0x81a5) {
        local_3c4 = format;
      }
      for (iVar2 = 0;
          iVar2 < (local_3d0->super_SparseTextureClampLookupResidencyTestCase).
                  super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                  super_SparseTextureCommitmentTestCase.mState.samples; iVar2 = iVar2 + 1) {
        local_3d4 = iVar2;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&shader,stc_compute_textureFill,(allocator<char> *)&s);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_330,"image",(allocator<char> *)&sources);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_350,"image",(allocator<char> *)&program);
        SparseTexture2CommitmentTestCase::createShaderTokens
                  (&s,(SparseTexture2CommitmentTestCase *)local_3d0,target,format,local_3d4,
                   &local_330,&local_350);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&local_330);
        this_01 = &s.returnType;
        std::__cxx11::string::string((string *)&local_370,(string *)this_01);
        generateExpectedResult
                  ((string *)&sources,(SparseTextureClampLookupColorTestCase *)this_01,&local_370,
                   local_3d8);
        std::__cxx11::string::operator=((string *)&s.resultExpected,(string *)&sources);
        std::__cxx11::string::~string((string *)&sources);
        std::__cxx11::string::~string((string *)&local_370);
        replaceToken("<INPUT_TYPE>",s.inputType._M_dataplus._M_p,&shader);
        replaceToken("<POINT_TYPE>",s.pointType._M_dataplus._M_p,&shader);
        replaceToken("<POINT_DEF>",s.pointDef._M_dataplus._M_p,&shader);
        replaceToken("<RETURN_TYPE>",s.returnType._M_dataplus._M_p,&shader);
        replaceToken("<RESULT_EXPECTED>",s.resultExpected._M_dataplus._M_p,&shader);
        replaceToken("<SAMPLE_DEF>",s.sampleDef._M_dataplus._M_p,&shader);
        memset(&sources,0,0xac);
        sources.transformFeedbackVaryings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        sources.transformFeedbackVaryings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        sources.transformFeedbackVaryings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        sources.transformFeedbackVaryings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        sources._193_8_ = 0;
        glu::ComputeSource::ComputeSource((ComputeSource *)&program,&shader);
        glu::ProgramSources::operator<<(&sources,(ShaderSource *)&program);
        iVar2 = local_3d4;
        std::__cxx11::string::~string
                  ((string *)
                   &program.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        glu::ShaderProgram::ShaderProgram
                  (&program,((local_3d0->super_SparseTextureClampLookupResidencyTestCase).
                             super_SparseTexture2LookupTestCase.
                             super_SparseTexture2CommitmentTestCase.
                             super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->
                            m_renderCtx,&sources);
        if (program.m_program.m_info.linkOk == true) {
          (*gl->useProgram)(program.m_program.m_program);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"glUseProgram",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                          ,0x2e1);
          (*gl->bindImageTexture)(0,*local_3b8,local_3d8,'\0',0,0x88b9,local_3c4);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"glBindImageTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                          ,0x2e4);
          (*gl->uniform1i)(1,0);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"glUniform1i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                          ,0x2e6);
          (*gl->dispatchCompute)(width,height,depth);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"glDispatchCompute",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                          ,0x2e8);
          (*gl->memoryBarrier)(0xffffffff);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"glMemoryBarrier",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                          ,0x2ea);
        }
        else {
          poVar4 = std::operator<<(local_3b0,
                                   "Compute shader compilation failed (writing) for target: ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,target);
          poVar4 = std::operator<<(poVar4,", format: ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,format);
          poVar4 = std::operator<<(poVar4,", sample: ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
          poVar4 = std::operator<<(poVar4,", infoLog: ");
          poVar4 = std::operator<<(poVar4,(string *)
                                          &((*program.m_shaders[5].
                                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                           infoLog);
          poVar4 = std::operator<<(poVar4,", shaderSource: ");
          poVar4 = std::operator<<(poVar4,shader._M_dataplus._M_p);
          std::operator<<(poVar4," - ");
        }
        glu::ShaderProgram::~ShaderProgram(&program);
        glu::ProgramSources::~ProgramSources(&sources);
        SparseTexture2CommitmentTestCase::TokenStrings::~TokenStrings(&s);
        std::__cxx11::string::~string((string *)&shader);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    return true;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid level",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
             ,0x2b0);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool SparseTextureClampLookupColorTestCase::writeDataToTexture(const Functions& gl, GLint target, GLint format,
															   GLuint& texture, GLint level)
{
	mLog << "Fill Texture with shader [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (width > 0 && height > 0 && depth >= mState.minDepth)
	{
		if (target == GL_TEXTURE_CUBE_MAP)
			depth = depth * 6;

		GLint texSize = width * height * depth * mState.format.getPixelSize();

		std::vector<GLubyte> vecData;
		vecData.resize(texSize);
		GLubyte* data = vecData.data();

		deMemset(data, 255, texSize);

		for (GLint sample = 0; sample < mState.samples; ++sample)
		{
			std::string shader = stc_compute_textureFill;

			// Adjust shader source to texture format
			TokenStrings s = createShaderTokens(target, format, sample);

			// Change expected result as it has to be adjusted to different levels
			s.resultExpected = generateExpectedResult(s.returnType, level);

			replaceToken("<INPUT_TYPE>", s.inputType.c_str(), shader);
			replaceToken("<POINT_TYPE>", s.pointType.c_str(), shader);
			replaceToken("<POINT_DEF>", s.pointDef.c_str(), shader);
			replaceToken("<RETURN_TYPE>", s.returnType.c_str(), shader);
			replaceToken("<RESULT_EXPECTED>", s.resultExpected.c_str(), shader);
			replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), shader);

			ProgramSources sources;
			sources << ComputeSource(shader);

			GLint convFormat = format;
			if (format == GL_DEPTH_COMPONENT16)
				convFormat = GL_R16;

			// Build and run shader
			ShaderProgram program(m_context.getRenderContext(), sources);
			if (program.isOk())
			{
				gl.useProgram(program.getProgram());
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");
				gl.bindImageTexture(0 /* unit */, texture, level /* level */, GL_FALSE /* layered */, 0 /* layer */,
									GL_WRITE_ONLY, convFormat);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
				gl.uniform1i(1, 0 /* image_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
				gl.dispatchCompute(width, height, depth);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute");
				gl.memoryBarrier(GL_ALL_BARRIER_BITS);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier");
			}
			else
			{
				mLog << "Compute shader compilation failed (writing) for target: " << target << ", format: " << format
					 << ", sample: " << sample << ", infoLog: " << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog
					 << ", shaderSource: " << shader.c_str() << " - ";
			}
		}
	}

	return true;
}